

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
 __thiscall ninx::parser::Parser::parse_operator_definition(Parser *this)

{
  TokenReader *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  Token *pTVar4;
  Limiter *this_01;
  mapped_type *pmVar5;
  pointer pcVar6;
  ParserException *pPVar7;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  string id;
  char limiter;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  this_00 = &in_RSI->reader;
  pTVar4 = TokenReader::get_token(this_00);
  if (pTVar4 == (Token *)0x0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Expected alias target, but could not find one.","");
    exception::ParserException::ParserException(pPVar7,(Token *)0x0,&in_RSI->origin,&local_78);
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*pTVar4->_vptr_Token[2])(pTVar4);
  if (iVar3 != 0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "Alias target name must be alphanumeric, and begin with a letter.","");
    exception::ParserException::ParserException(pPVar7,pTVar4,&in_RSI->origin,&local_78);
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
  lexer::token::Text::get_identifier_abi_cxx11_((Text *)&local_58);
  if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "Invalid function name. It must be alphanumeric, and begin with a letter.","");
    exception::ParserException::ParserException(pPVar7,pTVar4,&in_RSI->origin,&local_78);
    __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &local_78.field_2;
  pcVar6 = (local_58->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar6,pcVar6 + local_58->_M_string_length);
  iVar3 = TokenReader::check_type(this_00,LIMITER);
  if (iVar3 == 1) {
    pTVar4 = TokenReader::get_token(this_00);
    this_01 = (Limiter *)
              __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Limiter::typeinfo,
                             0);
    cVar2 = lexer::token::Limiter::get_limiter(this_01);
    local_50._M_dataplus._M_p._0_1_ = cVar2;
    pmVar5 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&in_RSI->operators,(key_type *)&local_50);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    pcVar6 = (pointer)operator_new(0x18);
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pcVar6[8] = '\0';
    pcVar6[9] = '\0';
    pcVar6[10] = '\0';
    pcVar6[0xb] = '\0';
    pcVar6[0xc] = '\0';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
    pcVar6[0x10] = '\0';
    pcVar6[0x11] = '\0';
    pcVar6[0x12] = '\0';
    pcVar6[0x13] = '\0';
    pcVar6[0x14] = '\0';
    pcVar6[0x15] = '\0';
    pcVar6[0x16] = '\0';
    pcVar6[0x17] = '\0';
    *(undefined ***)pcVar6 = &PTR__ASTElement_00150c10;
    (this->origin)._M_dataplus._M_p = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    return (__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
              )this;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Expected operator, but could not find one.","");
  generate_exception(in_RSI,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<NoopStatement> ninx::parser::Parser::parse_operator_definition() {
    // Extract the alias identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected alias target, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Alias target name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the operator limiter
    if (reader.check_type(Type::LIMITER) != 1) {
        generate_exception("Expected operator, but could not find one.");
    }

    char limiter {dynamic_cast<ninx::lexer::token::Limiter*>(reader.get_token())->get_limiter()};

    // Register the limiter in the operator table
    operators[limiter] = id;

    return std::make_unique<NoopStatement>();
}